

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O0

void run_timer_loop_once(void)

{
  int iVar1;
  undefined1 local_a8 [8];
  uv_timer_t timer_handle;
  uv_loop_t *loop;
  
  timer_handle.start_id = (uint64_t)uv_default_loop();
  timer_cb_called = 0;
  iVar1 = uv_timer_init((uv_loop_t *)timer_handle.start_id,(uv_timer_t *)local_a8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
            ,0x45,"0 == uv_timer_init(loop, &timer_handle)");
    abort();
  }
  iVar1 = uv_timer_start((uv_timer_t *)local_a8,timer_cb,1,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
            ,0x46,"0 == uv_timer_start(&timer_handle, timer_cb, 1, 0)");
    abort();
  }
  iVar1 = uv_run((uv_loop_t *)timer_handle.start_id,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
            ,0x47,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (timer_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c"
            ,0x48,"1 == timer_cb_called");
    abort();
  }
  return;
}

Assistant:

static void run_timer_loop_once(void) {
  uv_loop_t* loop;
  uv_timer_t timer_handle;

  loop = uv_default_loop();

  timer_cb_called = 0; /* Reset for the child. */

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);
}